

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O3

int quicly_foreach_stream
              (quicly_conn_t *conn,void *thunk,_func_int_void_ptr_quicly_stream_t_ptr *cb)

{
  int iVar1;
  kh_quicly_stream_t_t *pkVar2;
  khint_t kVar3;
  byte bVar4;
  uint uVar5;
  
  pkVar2 = conn->streams;
  kVar3 = pkVar2->n_buckets;
  if (kVar3 != 0) {
    bVar4 = 0;
    uVar5 = 0;
    do {
      if (((pkVar2->flags[uVar5 >> 4] >> (bVar4 & 0x1e) & 3) == 0) &&
         (-1 < pkVar2->vals[uVar5]->stream_id)) {
        iVar1 = (*cb)(thunk,pkVar2->vals[uVar5]);
        if (iVar1 != 0) {
          return iVar1;
        }
        pkVar2 = conn->streams;
        kVar3 = pkVar2->n_buckets;
      }
      uVar5 = uVar5 + 1;
      bVar4 = bVar4 + 2;
    } while (uVar5 != kVar3);
  }
  return 0;
}

Assistant:

int quicly_foreach_stream(quicly_conn_t *conn, void *thunk, int (*cb)(void *thunk, quicly_stream_t *stream))
{
    quicly_stream_t *stream;
    kh_foreach_value(conn->streams, stream, {
        if (stream->stream_id >= 0) {
            int ret = cb(thunk, stream);
            if (ret != 0)
                return ret;
        }
    });
    return 0;
}